

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAnimationTracks(OgreXmlSerializer *this,Animation *dest)

{
  bool bVar1;
  string *__lhs;
  DeadlyImportError *this_00;
  string sStack_238;
  VertexAnimationTrack track;
  string local_1a8 [11];
  
  NextNode_abi_cxx11_(this);
  while( true ) {
    bVar1 = std::operator==(&this->m_currentNodeName,"track");
    if (!bVar1) {
      return;
    }
    VertexAnimationTrack::VertexAnimationTrack(&track);
    track.type = VAT_TRANSFORM;
    ReadAttribute<std::__cxx11::string>(local_1a8,this,"bone");
    std::__cxx11::string::operator=((string *)&track.boneName,(string *)local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    __lhs = NextNode_abi_cxx11_(this);
    bVar1 = std::operator!=(__lhs,"keyframes");
    if (bVar1) break;
    ReadAnimationKeyFrames(this,dest,&track);
    std::
    vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
    ::push_back(&dest->tracks,&track);
    VertexAnimationTrack::~VertexAnimationTrack(&track);
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"No <keyframes> found in <track> ");
  std::operator<<((ostream *)local_1a8,(string *)&dest->name);
  std::__cxx11::stringbuf::str();
  DeadlyImportError::DeadlyImportError(this_00,&sStack_238);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreXmlSerializer::ReadAnimationTracks(Animation *dest)
{
    NextNode();
    while(m_currentNodeName == nnTrack)
    {
        VertexAnimationTrack track;
        track.type = VertexAnimationTrack::VAT_TRANSFORM;
        track.boneName = ReadAttribute<std::string>("bone");

        if (NextNode() != nnKeyFrames) {
            throw DeadlyImportError(Formatter::format() << "No <keyframes> found in <track> " << dest->name);
        }

        ReadAnimationKeyFrames(dest, &track);

        dest->tracks.push_back(track);
    }
}